

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

int nni_dialer_start(nni_dialer *d,uint flags)

{
  _Bool _Var1;
  nng_err nVar2;
  uint32_t uVar3;
  nni_aio *aio_00;
  undefined1 local_1f0 [8];
  nni_aio aio;
  
  _Var1 = nni_atomic_flag_test_and_set(&d->d_started);
  nVar2 = NNG_ESTATE;
  if (!_Var1) {
    nVar2 = NNG_OK;
    if ((flags & 2) == 0) {
      aio_00 = (nni_aio *)local_1f0;
      nni_aio_init(aio_00,(nni_cb)0x0,(void *)0x0);
      nni_aio_start(aio_00,(nni_aio_cancel_fn)0x0,(void *)0x0);
    }
    else {
      aio_00 = (nni_aio *)0x0;
    }
    nni_mtx_lock(&d->d_mtx);
    d->d_user_aio = aio_00;
    (*(d->d_ops).d_connect)(d->d_data,&d->d_con_aio);
    nni_mtx_unlock(&d->d_mtx);
    if (aio_00 != (nni_aio *)0x0) {
      nni_aio_wait(aio_00);
      nVar2 = nni_aio_result(aio_00);
      nni_aio_fini(aio_00);
    }
    uVar3 = nni_sock_id(d->d_sock);
    nng_log_info("NNG-DIAL","Starting dialer for socket<%u>",(ulong)uVar3);
  }
  return nVar2;
}

Assistant:

int
nni_dialer_start(nni_dialer *d, unsigned flags)
{
	int      rv = 0;
	nni_aio  aio;
	nni_aio *aiop = NULL;

	if (nni_atomic_flag_test_and_set(&d->d_started)) {
		return (NNG_ESTATE);
	}

	if ((flags & NNG_FLAG_NONBLOCK) != 0) {
		aiop = NULL;
	} else {
		nni_aio_init(&aio, NULL, NULL);
		aiop = &aio;
		nni_aio_start(aiop, NULL, NULL);
	}

	nni_mtx_lock(&d->d_mtx);
	d->d_user_aio = aiop;
	dialer_connect_start(d);
	nni_mtx_unlock(&d->d_mtx);

	if (aiop != NULL) {
		nni_aio_wait(aiop);
		rv = nni_aio_result(aiop);
		nni_aio_fini(aiop);
	}

	nng_log_info("NNG-DIAL", "Starting dialer for socket<%u>",
	    nni_sock_id(d->d_sock));

	return (rv);
}